

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Model::~Model(Model *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  pointer ppNVar3;
  pointer ppGVar4;
  pointer ppMVar5;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_0089ea10;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->culling)._M_dataplus._M_p;
  paVar1 = &(this->culling).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->shading)._M_dataplus._M_p;
  paVar1 = &(this->shading).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppNVar3 = (this->attributes).
            super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3,(long)(this->attributes).
                                  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar3
                   );
  }
  ppGVar4 = (this->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppGVar4 != (pointer)0x0) {
    operator_delete(ppGVar4,(long)(this->geometry).
                                  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppGVar4
                   );
  }
  ppMVar5 = (this->materials).
            super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar5 != (pointer)0x0) {
    operator_delete(ppMVar5,(long)(this->materials).
                                  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar5
                   );
  }
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Model::~Model()
{

}